

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3GenerateConstraintChecks
               (Parse *pParse,Table *pTab,int *aRegIdx,int iDataCur,int iIdxCur,int regNewData,
               int regOldData,u8 pkChng,u8 overrideError,int ignoreDest,int *pbMayReplace,
               int *aiChng,Upsert *pUpsert)

{
  short sVar1;
  ushort uVar2;
  sqlite3 *db;
  ExprList *pEVar3;
  Expr *pExpr;
  bool bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int addr;
  int iVar9;
  Vdbe *p;
  char *pcVar10;
  CollSeq *zP4;
  Trigger *pTVar11;
  Parse *pPVar12;
  HashElem *pHVar13;
  Op *pOVar14;
  int iVar15;
  byte bVar16;
  ulong uVar17;
  int iVar18;
  Index *pIdx;
  short *psVar19;
  int iVar20;
  int p2;
  long lVar21;
  uint uVar22;
  int op;
  ulong uVar23;
  long lVar24;
  char **ppcVar25;
  byte local_111;
  int local_104;
  int local_d8;
  uint local_d0;
  Upsert *local_a8;
  Index *local_a0;
  Index *local_98;
  int local_7c;
  
  db = pParse->db;
  p = sqlite3GetVdbe(pParse);
  sVar1 = pTab->nCol;
  if ((pTab->tabFlags & 0x20) == 0) {
    local_d0 = 1;
    local_a0 = (Index *)0x0;
  }
  else {
    for (local_a0 = pTab->pIndex;
        (local_a0 != (Index *)0x0 && ((*(ushort *)&local_a0->field_0x63 & 3) != 2));
        local_a0 = local_a0->pNext) {
    }
    local_d0 = (uint)local_a0->nKeyCol;
  }
  local_111 = overrideError;
  if (0 < sVar1) {
    iVar6 = regNewData + 1;
    lVar24 = 0;
    uVar17 = 0;
    do {
      if ((uVar17 != (uint)(int)pTab->iPKey) && ((aiChng == (int *)0x0 || (-1 < aiChng[uVar17])))) {
        bVar16 = (&pTab->aCol->notNull)[lVar24];
        if (bVar16 != 0) {
          if (bVar16 == 0xb) {
            bVar16 = 2;
          }
          if (overrideError != '\v') {
            bVar16 = overrideError;
          }
          if (bVar16 == 5) {
            uVar22 = (uint)(*(long *)((long)&pTab->aCol->pDflt + lVar24) != 0) * 3 + 2;
          }
          else {
            uVar22 = (uint)bVar16;
          }
          iVar7 = (int)uVar17;
          iVar9 = 0;
          switch(uVar22) {
          default:
            sqlite3VdbeAddOp3(p,0x32,iVar6 + iVar7,ignoreDest,0);
            break;
          case 5:
            iVar9 = pParse->nLabel + -1;
            pParse->nLabel = iVar9;
            iVar18 = iVar6 + iVar7;
            sqlite3VdbeAddOp3(p,0x33,iVar18,iVar9,0);
            sqlite3ExprCode(pParse,*(Expr **)((long)&pTab->aCol->pDflt + lVar24),iVar18);
            sqlite3VdbeAddOp3(p,0x33,iVar18,iVar9,0);
          case 2:
            pPVar12 = pParse->pToplevel;
            if (pParse->pToplevel == (Parse *)0x0) {
              pPVar12 = pParse;
            }
            pPVar12->mayAbort = '\x01';
            uVar22 = 2;
          case 1:
          case 3:
            pcVar10 = sqlite3MPrintf(db,"%s.%s",pTab->zName,
                                     *(undefined8 *)((long)&pTab->aCol->zName + lVar24));
            sqlite3VdbeAddOp3(p,0x44,0x513,uVar22,iVar6 + iVar7);
            if (p->db->mallocFailed == '\0') {
              pOVar14 = p->aOp;
              iVar7 = p->nOp;
              pOVar14[(long)iVar7 + -1].p4type = -7;
              pOVar14[(long)iVar7 + -1].p4.p = pcVar10;
            }
            else if (pcVar10 != (char *)0x0) {
              sqlite3DbFreeNN(p->db,pcVar10);
            }
            if (0 < (long)p->nOp) {
              p->aOp[(long)p->nOp + -1].p5 = 1;
            }
            if (iVar9 != 0) {
              sqlite3VdbeResolveLabel(p,iVar9);
            }
          }
        }
      }
      uVar17 = uVar17 + 1;
      lVar24 = lVar24 + 0x20;
    } while ((long)sVar1 != uVar17);
  }
  pEVar3 = pTab->pCheck;
  if ((pEVar3 != (ExprList *)0x0) && ((db->flags & 0x200) == 0)) {
    pParse->iSelfTab = ~regNewData;
    if (0 < pEVar3->nExpr) {
      if (overrideError == '\v') {
        overrideError = 2;
      }
      uVar22 = (uint)overrideError;
      ppcVar25 = &pEVar3->a[0].zName;
      lVar24 = 0;
      do {
        pExpr = ((ExprList_item *)(ppcVar25 + -1))->pExpr;
        if ((aiChng == (int *)0x0) ||
           (iVar6 = sqlite3ExprReferencesUpdatedColumn(pExpr,aiChng,(uint)pkChng), iVar6 != 0)) {
          iVar6 = pParse->nLabel + -1;
          pParse->nLabel = iVar6;
          sqlite3ExprIfTrue(pParse,pExpr,iVar6,0x10);
          if (uVar22 == 4) {
            sqlite3VdbeAddOp3(p,0xb,0,ignoreDest,0);
            uVar22 = 4;
          }
          else {
            pcVar10 = *ppcVar25;
            if (pcVar10 == (char *)0x0) {
              pcVar10 = pTab->zName;
            }
            if (uVar22 == 5) {
              uVar22 = 2;
            }
            sqlite3HaltConstraint(pParse,0x113,uVar22,pcVar10,'\0','\x03');
          }
          sqlite3VdbeResolveLabel(p,iVar6);
        }
        lVar24 = lVar24 + 1;
        ppcVar25 = ppcVar25 + 4;
      } while (lVar24 < pEVar3->nExpr);
    }
    pParse->iSelfTab = 0;
  }
  iVar6 = 0;
  if (pUpsert == (Upsert *)0x0) {
    iVar7 = 0;
    local_98 = (Index *)0x0;
    local_a8 = (Upsert *)0x0;
  }
  else if (pUpsert->pUpsertTarget == (ExprList *)0x0) {
    local_111 = 4;
    iVar7 = 0;
    local_98 = (Index *)0x0;
    local_a8 = (Upsert *)0x0;
  }
  else {
    local_a8 = pUpsert;
    local_98 = pUpsert->pUpsertIdx;
    if (local_98 == (Index *)0x0) {
      iVar7 = 0;
      local_98 = (Index *)0x0;
    }
    else {
      iVar7 = sqlite3VdbeAddOp3(p,0xb,0,0,0);
    }
  }
  if (pkChng == '\0') {
    local_d8 = 0;
    iVar9 = 0;
    goto LAB_001a487d;
  }
  local_d8 = 0;
  iVar9 = 0;
  if (local_a0 != (Index *)0x0) goto LAB_001a487d;
  iVar18 = pParse->nLabel + -1;
  pParse->nLabel = iVar18;
  uVar22 = (uint)local_111;
  if (local_111 == 0xb) {
    uVar22 = 2;
    if ((char)*(uint *)&pTab->keyConf != '\v') {
      uVar22 = *(uint *)&pTab->keyConf;
    }
  }
  if ((local_a8 != (Upsert *)0x0) && (local_a8->pUpsertIdx == (Index *)0x0)) {
    uVar22 = (uint)(byte)((local_a8->pUpsertSet != (ExprList *)0x0) * '\x02' | 4);
  }
  iVar6 = 0;
  bVar16 = (byte)uVar22;
  if (((local_111 != 5) && (bVar16 == 5)) && (pTab->pIndex != (Index *)0x0)) {
    iVar6 = sqlite3VdbeAddOp3(p,0xb,0,0,0);
    iVar6 = iVar6 + 1;
  }
  if (regOldData != 0) {
    sqlite3VdbeAddOp3(p,0x35,regNewData,iVar18,regOldData);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = 0x90;
    }
  }
  sqlite3VdbeAddOp3(p,0x1f,iDataCur,iVar18,regNewData);
  switch(uVar22 & 0xff) {
  case 5:
    if ((db->flags & 0x2000) == 0) {
      pTVar11 = (Trigger *)0x0;
    }
    else {
      pTVar11 = sqlite3TriggersExist(pParse,pTab,0x79,(ExprList *)0x0,(int *)0x0);
    }
    if ((pTVar11 == (Trigger *)0x0) &&
       (iVar9 = sqlite3FkRequired(pParse,pTab,(int *)0x0,0), iVar9 == 0)) {
      iVar9 = 1;
      if (pTab->pIndex != (Index *)0x0) {
        pPVar12 = pParse->pToplevel;
        if (pParse->pToplevel == (Parse *)0x0) {
          pPVar12 = pParse;
        }
        pPVar12->isMultiWrite = '\x01';
        sqlite3GenerateRowIndexDelete(pParse,pTab,iDataCur,iIdxCur,(int *)0x0,-1);
      }
    }
    else {
      pPVar12 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar12 = pParse;
      }
      pPVar12->isMultiWrite = '\x01';
      iVar9 = 1;
      sqlite3GenerateRowDelete
                (pParse,pTab,pTVar11,iDataCur,iIdxCur,regNewData,1,'\0','\x05','\x01',-1);
    }
    goto LAB_001a4811;
  case 6:
    sqlite3UpsertDoUpdate(pParse,local_a8,pTab,(Index *)0x0,iDataCur);
  case 4:
    sqlite3VdbeAddOp3(p,0xb,0,ignoreDest,0);
    break;
  default:
    bVar16 = 2;
  case 1:
  case 2:
  case 3:
    sqlite3RowidConstraint(pParse,(uint)bVar16,pTab);
  }
  iVar9 = 0;
LAB_001a4811:
  sqlite3VdbeResolveLabel(p,iVar18);
  if (iVar6 == 0) {
    local_d8 = 0;
  }
  else {
    local_d8 = sqlite3VdbeAddOp3(p,0xb,0,0,0);
    if (p->db->mallocFailed == '\0') {
      iVar18 = iVar6;
      if (iVar6 < 1) {
        iVar18 = p->nOp;
      }
      pOVar14 = p->aOp + (long)iVar18 + -1;
    }
    else {
      pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar14->p2 = p->nOp;
  }
LAB_001a487d:
  pIdx = pTab->pIndex;
  if (pIdx != (Index *)0x0) {
    lVar24 = 0;
    local_7c = 0;
    bVar4 = false;
    do {
      if (aRegIdx[lVar24] != 0) {
        if (local_98 == pIdx) {
          local_7c = sqlite3VdbeAddOp3(p,0xb,0,0,0);
          pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
          if (p->db->mallocFailed == '\0') {
            iVar18 = p->nOp + -1;
            if (-1 < iVar7) {
              iVar18 = iVar7;
            }
            pOVar14 = p->aOp + iVar18;
          }
          pOVar14->p2 = p->nOp;
          local_104 = iVar7 + 1;
        }
        else {
          local_104 = pParse->nLabel + -1;
          pParse->nLabel = local_104;
        }
        if ((!bVar4) && (local_98 == (Index *)0x0 || local_98 == pIdx)) {
          sqlite3TableAffinity(p,pTab,regNewData + 1);
          bVar4 = true;
        }
        if (pIdx->pPartIdxWhere != (Expr *)0x0) {
          iVar18 = aRegIdx[lVar24];
          sqlite3VdbeAddOp3(p,0x49,0,iVar18,0);
          pParse->iSelfTab = ~regNewData;
          sqlite3ExprIfFalseDup(pParse,pIdx->pPartIdxWhere,local_104,iVar18);
          pParse->iSelfTab = 0;
        }
        iVar18 = aRegIdx[lVar24] + 1;
        uVar17 = (ulong)pIdx->nColumn;
        if (pIdx->nColumn != 0) {
          lVar21 = 4;
          uVar23 = 0;
          do {
            uVar2 = pIdx->aiColumn[uVar23];
            iVar8 = regNewData;
            if (uVar2 == 0xffff) {
LAB_001a4aac:
              sqlite3VdbeAddOp3(p,(uVar2 >> 0xf) + 0x4f,iVar8,iVar18 + (int)uVar23,0);
            }
            else {
              if (uVar2 != 0xfffe) {
                if (uVar2 != pTab->iPKey) {
                  iVar8 = (int)(short)uVar2 + regNewData + 1;
                }
                goto LAB_001a4aac;
              }
              pParse->iSelfTab = ~regNewData;
              sqlite3ExprCodeCopy(pParse,*(Expr **)((long)pIdx->aColExpr->a + lVar21 * 2 + -8),
                                  iVar18 + (int)uVar23);
              pParse->iSelfTab = 0;
            }
            uVar23 = uVar23 + 1;
            uVar17 = (ulong)pIdx->nColumn;
            lVar21 = lVar21 + 0x10;
          } while (uVar23 < uVar17);
        }
        sqlite3VdbeAddOp3(p,0x5c,iVar18,(int)uVar17,aRegIdx[lVar24]);
        if ((((regOldData == 0) || (pkChng != '\0')) || (local_a0 != pIdx)) &&
           (bVar16 = pIdx->onError, bVar16 != 0)) {
          if (bVar16 == 0xb) {
            bVar16 = 2;
          }
          bVar5 = local_111;
          if (local_111 == 0xb) {
            bVar5 = bVar16;
          }
          if (local_98 == pIdx) {
            uVar22 = (uint)(local_a8->pUpsertSet != (ExprList *)0x0) * 2 + 4;
          }
          else {
            uVar22 = (uint)bVar5;
          }
          if (((((lVar24 == 0) && (pIdx->pNext == (Index *)0x0)) &&
               ((local_a0 == pIdx && (uVar22 == 5)))) &&
              (((db->flags & 0x2000) == 0 ||
               (pTVar11 = sqlite3TriggersExist(pParse,pTab,0x79,(ExprList *)0x0,(int *)0x0),
               pTVar11 == (Trigger *)0x0)))) &&
             (((db->flags & 0x4000) == 0 ||
              ((pTab->pFKey == (FKey *)0x0 &&
               (pHVar13 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,(uint *)0x0),
               pHVar13->data == (void *)0x0)))))) {
            sqlite3VdbeResolveLabel(p,local_104);
          }
          else {
            iVar15 = (int)lVar24 + iIdxCur;
            uVar2 = pIdx->nKeyCol;
            iVar8 = sqlite3VdbeAddOp3(p,0x1b,iVar15,local_104,iVar18);
            if (p->db->mallocFailed == '\0') {
              pOVar14 = p->aOp;
              pOVar14[iVar8].p4type = -3;
              *(uint *)&pOVar14[iVar8].p4 = (uint)uVar2;
            }
            iVar8 = iVar18;
            if (pIdx != local_a0) {
              iVar8 = sqlite3GetTempRange(pParse,local_d0);
            }
            if ((regOldData != 0) || (uVar22 == 5)) {
              if ((pTab->tabFlags & 0x20) == 0) {
                sqlite3VdbeAddOp3(p,0x87,iVar15,iVar8,0);
                if (regOldData != 0) {
                  sqlite3VdbeAddOp3(p,0x35,iVar8,local_104,regOldData);
                  if (0 < (long)p->nOp) {
                    p->aOp[(long)p->nOp + -1].p5 = 0x90;
                  }
                }
              }
              else {
                if ((pIdx != local_a0) && (local_a0->nKeyCol != 0)) {
                  uVar17 = 0;
                  do {
                    iVar20 = -1;
                    if (pIdx->nColumn != 0) {
                      psVar19 = pIdx->aiColumn;
                      lVar21 = 0;
                      do {
                        if (*psVar19 == local_a0->aiColumn[uVar17]) {
                          iVar20 = (int)lVar21 >> 0x10;
                          break;
                        }
                        lVar21 = lVar21 + 0x10000;
                        psVar19 = psVar19 + 1;
                      } while ((ulong)pIdx->nColumn * 0x10000 != lVar21);
                    }
                    sqlite3VdbeAddOp3(p,0x5a,iVar15,iVar20,iVar8 + (int)uVar17);
                    uVar17 = uVar17 + 1;
                  } while (uVar17 < local_a0->nKeyCol);
                }
                if ((regOldData != 0) && (local_a0->nKeyCol != 0)) {
                  iVar20 = iVar8;
                  if ((*(ushort *)&pIdx->field_0x63 & 3) == 2) {
                    iVar20 = iVar18;
                  }
                  p2 = (uint)local_a0->nKeyCol + p->nOp;
                  op = 0x34;
                  uVar17 = 0;
                  do {
                    zP4 = sqlite3LocateCollSeq(pParse,local_a0->azColl[uVar17]);
                    if (uVar17 == local_a0->nKeyCol - 1) {
                      op = 0x35;
                      p2 = local_104;
                    }
                    addr = sqlite3VdbeAddOp3(p,op,(int)local_a0->aiColumn[uVar17] + regOldData + 1,
                                             p2,iVar20 + (int)uVar17);
                    sqlite3VdbeChangeP4(p,addr,(char *)zP4,-2);
                    if (0 < (long)p->nOp) {
                      p->aOp[(long)p->nOp + -1].p5 = 0x90;
                    }
                    uVar17 = uVar17 + 1;
                  } while (uVar17 < local_a0->nKeyCol);
                }
              }
            }
            if (uVar22 - 1 < 3) {
              sqlite3UniqueConstraint(pParse,uVar22,pIdx);
            }
            else {
              if (uVar22 != 4) {
                if (uVar22 != 6) {
                  if ((db->flags & 0x2000) == 0) {
                    pTVar11 = (Trigger *)0x0;
                  }
                  else {
                    pTVar11 = sqlite3TriggersExist(pParse,pTab,0x79,(ExprList *)0x0,(int *)0x0);
                  }
                  if ((pTVar11 != (Trigger *)0x0) ||
                     (iVar9 = sqlite3FkRequired(pParse,pTab,(int *)0x0,0), iVar9 != 0)) {
                    pPVar12 = pParse->pToplevel;
                    if (pParse->pToplevel == (Parse *)0x0) {
                      pPVar12 = pParse;
                    }
                    pPVar12->isMultiWrite = '\x01';
                  }
                  sqlite3GenerateRowDelete
                            (pParse,pTab,pTVar11,iDataCur,iIdxCur,iVar8,(i16)local_d0,'\0','\x05',
                             pIdx == local_a0,iVar15);
                  iVar9 = 1;
                  goto LAB_001a4ff2;
                }
                sqlite3UpsertDoUpdate(pParse,local_a8,pTab,pIdx,iVar15);
              }
              sqlite3VdbeAddOp3(p,0xb,0,ignoreDest,0);
            }
LAB_001a4ff2:
            if (local_98 == pIdx) {
              sqlite3VdbeAddOp3(p,0xb,0,iVar7 + 1,0);
              pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
              if (p->db->mallocFailed == '\0') {
                iVar15 = p->nOp + -1;
                if (-1 < local_7c) {
                  iVar15 = local_7c;
                }
                pOVar14 = p->aOp + iVar15;
              }
              pOVar14->p2 = p->nOp;
            }
            else {
              sqlite3VdbeResolveLabel(p,local_104);
            }
            if (iVar8 != iVar18) {
              if (local_d0 == 1) {
                if (iVar8 != 0) {
                  bVar16 = pParse->nTempReg;
                  if ((ulong)bVar16 < 8) {
                    pParse->nTempReg = bVar16 + 1;
                    pParse->aTempReg[bVar16] = iVar8;
                  }
                }
              }
              else if (pParse->nRangeReg < (int)local_d0) {
                pParse->nRangeReg = local_d0;
                pParse->iRangeReg = iVar8;
              }
            }
          }
        }
        else {
          sqlite3VdbeResolveLabel(p,local_104);
        }
      }
      lVar24 = lVar24 + 1;
      pIdx = pIdx->pNext;
    } while (pIdx != (Index *)0x0);
  }
  if (iVar6 != 0) {
    sqlite3VdbeAddOp3(p,0xb,0,iVar6,0);
    if (p->db->mallocFailed == '\0') {
      iVar6 = p->nOp + -1;
      if (-1 < local_d8) {
        iVar6 = local_d8;
      }
      pOVar14 = p->aOp + iVar6;
    }
    else {
      pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar14->p2 = p->nOp;
  }
  *pbMayReplace = iVar9;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateConstraintChecks(
  Parse *pParse,       /* The parser context */
  Table *pTab,         /* The table being inserted or updated */
  int *aRegIdx,        /* Use register aRegIdx[i] for index i.  0 for unused */
  int iDataCur,        /* Canonical data cursor (main table or PK index) */
  int iIdxCur,         /* First index cursor */
  int regNewData,      /* First register in a range holding values to insert */
  int regOldData,      /* Previous content.  0 for INSERTs */
  u8 pkChng,           /* Non-zero if the rowid or PRIMARY KEY changed */
  u8 overrideError,    /* Override onError to this if not OE_Default */
  int ignoreDest,      /* Jump to this label on an OE_Ignore resolution */
  int *pbMayReplace,   /* OUT: Set to true if constraint may cause a replace */
  int *aiChng,         /* column i is unchanged if aiChng[i]<0 */
  Upsert *pUpsert      /* ON CONFLICT clauses, if any.  NULL otherwise */
){
  Vdbe *v;             /* VDBE under constrution */
  Index *pIdx;         /* Pointer to one of the indices */
  Index *pPk = 0;      /* The PRIMARY KEY index */
  sqlite3 *db;         /* Database connection */
  int i;               /* loop counter */
  int ix;              /* Index loop counter */
  int nCol;            /* Number of columns */
  int onError;         /* Conflict resolution strategy */
  int addr1;           /* Address of jump instruction */
  int seenReplace = 0; /* True if REPLACE is used to resolve INT PK conflict */
  int nPkField;        /* Number of fields in PRIMARY KEY. 1 for ROWID tables */
  Index *pUpIdx = 0;   /* Index to which to apply the upsert */
  u8 isUpdate;         /* True if this is an UPDATE operation */
  u8 bAffinityDone = 0;  /* True if the OP_Affinity operation has been run */
  int upsertBypass = 0;  /* Address of Goto to bypass upsert subroutine */
  int upsertJump = 0;    /* Address of Goto that jumps into upsert subroutine */
  int ipkTop = 0;        /* Top of the IPK uniqueness check */
  int ipkBottom = 0;     /* OP_Goto at the end of the IPK uniqueness check */

  isUpdate = regOldData!=0;
  db = pParse->db;
  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  assert( pTab->pSelect==0 );  /* This table is not a VIEW */
  nCol = pTab->nCol;
  
  /* pPk is the PRIMARY KEY index for WITHOUT ROWID tables and NULL for
  ** normal rowid tables.  nPkField is the number of key fields in the 
  ** pPk index or 1 for a rowid table.  In other words, nPkField is the
  ** number of fields in the true primary key of the table. */
  if( HasRowid(pTab) ){
    pPk = 0;
    nPkField = 1;
  }else{
    pPk = sqlite3PrimaryKeyIndex(pTab);
    nPkField = pPk->nKeyCol;
  }

  /* Record that this module has started */
  VdbeModuleComment((v, "BEGIN: GenCnstCks(%d,%d,%d,%d,%d)",
                     iDataCur, iIdxCur, regNewData, regOldData, pkChng));

  /* Test all NOT NULL constraints.
  */
  for(i=0; i<nCol; i++){
    if( i==pTab->iPKey ){
      continue;        /* ROWID is never NULL */
    }
    if( aiChng && aiChng[i]<0 ){
      /* Don't bother checking for NOT NULL on columns that do not change */
      continue;
    }
    onError = pTab->aCol[i].notNull;
    if( onError==OE_None ) continue;  /* This column is allowed to be NULL */
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }
    if( onError==OE_Replace && pTab->aCol[i].pDflt==0 ){
      onError = OE_Abort;
    }
    assert( onError==OE_Rollback || onError==OE_Abort || onError==OE_Fail
        || onError==OE_Ignore || onError==OE_Replace );
    addr1 = 0;
    switch( onError ){
      case OE_Replace: {
        assert( onError==OE_Replace );
        addr1 = sqlite3VdbeMakeLabel(pParse);
        sqlite3VdbeAddOp2(v, OP_NotNull, regNewData+1+i, addr1);
          VdbeCoverage(v);
        sqlite3ExprCode(pParse, pTab->aCol[i].pDflt, regNewData+1+i);
        sqlite3VdbeAddOp2(v, OP_NotNull, regNewData+1+i, addr1);
          VdbeCoverage(v);
        onError = OE_Abort;
        /* Fall through into the OE_Abort case to generate code that runs
        ** if both the input and the default value are NULL */
      }
      case OE_Abort:
        sqlite3MayAbort(pParse);
        /* Fall through */
      case OE_Rollback:
      case OE_Fail: {
        char *zMsg = sqlite3MPrintf(db, "%s.%s", pTab->zName,
                                    pTab->aCol[i].zName);
        sqlite3VdbeAddOp3(v, OP_HaltIfNull, SQLITE_CONSTRAINT_NOTNULL, onError,
                          regNewData+1+i);
        sqlite3VdbeAppendP4(v, zMsg, P4_DYNAMIC);
        sqlite3VdbeChangeP5(v, P5_ConstraintNotNull);
        VdbeCoverage(v);
        if( addr1 ) sqlite3VdbeResolveLabel(v, addr1);
        break;
      }
      default: {
        assert( onError==OE_Ignore );
        sqlite3VdbeAddOp2(v, OP_IsNull, regNewData+1+i, ignoreDest);
        VdbeCoverage(v);
        break;
      }
    }
  }

  /* Test all CHECK constraints
  */
#ifndef SQLITE_OMIT_CHECK
  if( pTab->pCheck && (db->flags & SQLITE_IgnoreChecks)==0 ){
    ExprList *pCheck = pTab->pCheck;
    pParse->iSelfTab = -(regNewData+1);
    onError = overrideError!=OE_Default ? overrideError : OE_Abort;
    for(i=0; i<pCheck->nExpr; i++){
      int allOk;
      Expr *pExpr = pCheck->a[i].pExpr;
      if( aiChng
       && !sqlite3ExprReferencesUpdatedColumn(pExpr, aiChng, pkChng)
      ){
        /* The check constraints do not reference any of the columns being
        ** updated so there is no point it verifying the check constraint */
        continue;
      }
      allOk = sqlite3VdbeMakeLabel(pParse);
      sqlite3VdbeVerifyAbortable(v, onError);
      sqlite3ExprIfTrue(pParse, pExpr, allOk, SQLITE_JUMPIFNULL);
      if( onError==OE_Ignore ){
        sqlite3VdbeGoto(v, ignoreDest);
      }else{
        char *zName = pCheck->a[i].zName;
        if( zName==0 ) zName = pTab->zName;
        if( onError==OE_Replace ) onError = OE_Abort; /* IMP: R-15569-63625 */
        sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_CHECK,
                              onError, zName, P4_TRANSIENT,
                              P5_ConstraintCheck);
      }
      sqlite3VdbeResolveLabel(v, allOk);
    }
    pParse->iSelfTab = 0;
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* UNIQUE and PRIMARY KEY constraints should be handled in the following
  ** order:
  **
  **   (1)  OE_Update
  **   (2)  OE_Abort, OE_Fail, OE_Rollback, OE_Ignore
  **   (3)  OE_Replace
  **
  ** OE_Fail and OE_Ignore must happen before any changes are made.
  ** OE_Update guarantees that only a single row will change, so it
  ** must happen before OE_Replace.  Technically, OE_Abort and OE_Rollback
  ** could happen in any order, but they are grouped up front for
  ** convenience.
  **
  ** 2018-08-14: Ticket https://www.sqlite.org/src/info/908f001483982c43
  ** The order of constraints used to have OE_Update as (2) and OE_Abort
  ** and so forth as (1). But apparently PostgreSQL checks the OE_Update
  ** constraint before any others, so it had to be moved.
  **
  ** Constraint checking code is generated in this order:
  **   (A)  The rowid constraint
  **   (B)  Unique index constraints that do not have OE_Replace as their
  **        default conflict resolution strategy
  **   (C)  Unique index that do use OE_Replace by default.
  **
  ** The ordering of (2) and (3) is accomplished by making sure the linked
  ** list of indexes attached to a table puts all OE_Replace indexes last
  ** in the list.  See sqlite3CreateIndex() for where that happens.
  */

  if( pUpsert ){
    if( pUpsert->pUpsertTarget==0 ){
      /* An ON CONFLICT DO NOTHING clause, without a constraint-target.
      ** Make all unique constraint resolution be OE_Ignore */
      assert( pUpsert->pUpsertSet==0 );
      overrideError = OE_Ignore;
      pUpsert = 0;
    }else if( (pUpIdx = pUpsert->pUpsertIdx)!=0 ){
      /* If the constraint-target uniqueness check must be run first.
      ** Jump to that uniqueness check now */
      upsertJump = sqlite3VdbeAddOp0(v, OP_Goto);
      VdbeComment((v, "UPSERT constraint goes first"));
    }
  }

  /* If rowid is changing, make sure the new rowid does not previously
  ** exist in the table.
  */
  if( pkChng && pPk==0 ){
    int addrRowidOk = sqlite3VdbeMakeLabel(pParse);

    /* Figure out what action to take in case of a rowid collision */
    onError = pTab->keyConf;
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }

    /* figure out whether or not upsert applies in this case */
    if( pUpsert && pUpsert->pUpsertIdx==0 ){
      if( pUpsert->pUpsertSet==0 ){
        onError = OE_Ignore;  /* DO NOTHING is the same as INSERT OR IGNORE */
      }else{
        onError = OE_Update;  /* DO UPDATE */
      }
    }

    /* If the response to a rowid conflict is REPLACE but the response
    ** to some other UNIQUE constraint is FAIL or IGNORE, then we need
    ** to defer the running of the rowid conflict checking until after
    ** the UNIQUE constraints have run.
    */
    if( onError==OE_Replace      /* IPK rule is REPLACE */
     && onError!=overrideError   /* Rules for other contraints are different */
     && pTab->pIndex             /* There exist other constraints */
    ){
      ipkTop = sqlite3VdbeAddOp0(v, OP_Goto)+1;
      VdbeComment((v, "defer IPK REPLACE until last"));
    }

    if( isUpdate ){
      /* pkChng!=0 does not mean that the rowid has changed, only that
      ** it might have changed.  Skip the conflict logic below if the rowid
      ** is unchanged. */
      sqlite3VdbeAddOp3(v, OP_Eq, regNewData, addrRowidOk, regOldData);
      sqlite3VdbeChangeP5(v, SQLITE_NOTNULL);
      VdbeCoverage(v);
    }

    /* Check to see if the new rowid already exists in the table.  Skip
    ** the following conflict logic if it does not. */
    VdbeNoopComment((v, "uniqueness check for ROWID"));
    sqlite3VdbeVerifyAbortable(v, onError);
    sqlite3VdbeAddOp3(v, OP_NotExists, iDataCur, addrRowidOk, regNewData);
    VdbeCoverage(v);

    switch( onError ){
      default: {
        onError = OE_Abort;
        /* Fall thru into the next case */
      }
      case OE_Rollback:
      case OE_Abort:
      case OE_Fail: {
        testcase( onError==OE_Rollback );
        testcase( onError==OE_Abort );
        testcase( onError==OE_Fail );
        sqlite3RowidConstraint(pParse, onError, pTab);
        break;
      }
      case OE_Replace: {
        /* If there are DELETE triggers on this table and the
        ** recursive-triggers flag is set, call GenerateRowDelete() to
        ** remove the conflicting row from the table. This will fire
        ** the triggers and remove both the table and index b-tree entries.
        **
        ** Otherwise, if there are no triggers or the recursive-triggers
        ** flag is not set, but the table has one or more indexes, call 
        ** GenerateRowIndexDelete(). This removes the index b-tree entries 
        ** only. The table b-tree entry will be replaced by the new entry 
        ** when it is inserted.  
        **
        ** If either GenerateRowDelete() or GenerateRowIndexDelete() is called,
        ** also invoke MultiWrite() to indicate that this VDBE may require
        ** statement rollback (if the statement is aborted after the delete
        ** takes place). Earlier versions called sqlite3MultiWrite() regardless,
        ** but being more selective here allows statements like:
        **
        **   REPLACE INTO t(rowid) VALUES($newrowid)
        **
        ** to run without a statement journal if there are no indexes on the
        ** table.
        */
        Trigger *pTrigger = 0;
        if( db->flags&SQLITE_RecTriggers ){
          pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
        }
        if( pTrigger || sqlite3FkRequired(pParse, pTab, 0, 0) ){
          sqlite3MultiWrite(pParse);
          sqlite3GenerateRowDelete(pParse, pTab, pTrigger, iDataCur, iIdxCur,
                                   regNewData, 1, 0, OE_Replace, 1, -1);
        }else{
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
          assert( HasRowid(pTab) );
          /* This OP_Delete opcode fires the pre-update-hook only. It does
          ** not modify the b-tree. It is more efficient to let the coming
          ** OP_Insert replace the existing entry than it is to delete the
          ** existing entry and then insert a new one. */
          sqlite3VdbeAddOp2(v, OP_Delete, iDataCur, OPFLAG_ISNOOP);
          sqlite3VdbeAppendP4(v, pTab, P4_TABLE);
#endif /* SQLITE_ENABLE_PREUPDATE_HOOK */
          if( pTab->pIndex ){
            sqlite3MultiWrite(pParse);
            sqlite3GenerateRowIndexDelete(pParse, pTab, iDataCur, iIdxCur,0,-1);
          }
        }
        seenReplace = 1;
        break;
      }
#ifndef SQLITE_OMIT_UPSERT
      case OE_Update: {
        sqlite3UpsertDoUpdate(pParse, pUpsert, pTab, 0, iDataCur);
        /* Fall through */
      }
#endif
      case OE_Ignore: {
        testcase( onError==OE_Ignore );
        sqlite3VdbeGoto(v, ignoreDest);
        break;
      }
    }
    sqlite3VdbeResolveLabel(v, addrRowidOk);
    if( ipkTop ){
      ipkBottom = sqlite3VdbeAddOp0(v, OP_Goto);
      sqlite3VdbeJumpHere(v, ipkTop-1);
    }
  }

  /* Test all UNIQUE constraints by creating entries for each UNIQUE
  ** index and making sure that duplicate entries do not already exist.
  ** Compute the revised record entries for indices as we go.
  **
  ** This loop also handles the case of the PRIMARY KEY index for a
  ** WITHOUT ROWID table.
  */
  for(ix=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, ix++){
    int regIdx;          /* Range of registers hold conent for pIdx */
    int regR;            /* Range of registers holding conflicting PK */
    int iThisCur;        /* Cursor for this UNIQUE index */
    int addrUniqueOk;    /* Jump here if the UNIQUE constraint is satisfied */

    if( aRegIdx[ix]==0 ) continue;  /* Skip indices that do not change */
    if( pUpIdx==pIdx ){
      addrUniqueOk = upsertJump+1;
      upsertBypass = sqlite3VdbeGoto(v, 0);
      VdbeComment((v, "Skip upsert subroutine"));
      sqlite3VdbeJumpHere(v, upsertJump);
    }else{
      addrUniqueOk = sqlite3VdbeMakeLabel(pParse);
    }
    if( bAffinityDone==0 && (pUpIdx==0 || pUpIdx==pIdx) ){
      sqlite3TableAffinity(v, pTab, regNewData+1);
      bAffinityDone = 1;
    }
    VdbeNoopComment((v, "uniqueness check for %s", pIdx->zName));
    iThisCur = iIdxCur+ix;


    /* Skip partial indices for which the WHERE clause is not true */
    if( pIdx->pPartIdxWhere ){
      sqlite3VdbeAddOp2(v, OP_Null, 0, aRegIdx[ix]);
      pParse->iSelfTab = -(regNewData+1);
      sqlite3ExprIfFalseDup(pParse, pIdx->pPartIdxWhere, addrUniqueOk,
                            SQLITE_JUMPIFNULL);
      pParse->iSelfTab = 0;
    }

    /* Create a record for this index entry as it should appear after
    ** the insert or update.  Store that record in the aRegIdx[ix] register
    */
    regIdx = aRegIdx[ix]+1;
    for(i=0; i<pIdx->nColumn; i++){
      int iField = pIdx->aiColumn[i];
      int x;
      if( iField==XN_EXPR ){
        pParse->iSelfTab = -(regNewData+1);
        sqlite3ExprCodeCopy(pParse, pIdx->aColExpr->a[i].pExpr, regIdx+i);
        pParse->iSelfTab = 0;
        VdbeComment((v, "%s column %d", pIdx->zName, i));
      }else{
        if( iField==XN_ROWID || iField==pTab->iPKey ){
          x = regNewData;
        }else{
          x = iField + regNewData + 1;
        }
        sqlite3VdbeAddOp2(v, iField<0 ? OP_IntCopy : OP_SCopy, x, regIdx+i);
        VdbeComment((v, "%s", iField<0 ? "rowid" : pTab->aCol[iField].zName));
      }
    }
    sqlite3VdbeAddOp3(v, OP_MakeRecord, regIdx, pIdx->nColumn, aRegIdx[ix]);
    VdbeComment((v, "for %s", pIdx->zName));
#ifdef SQLITE_ENABLE_NULL_TRIM
    if( pIdx->idxType==SQLITE_IDXTYPE_PRIMARYKEY ){
      sqlite3SetMakeRecordP5(v, pIdx->pTable);
    }
#endif

    /* In an UPDATE operation, if this index is the PRIMARY KEY index 
    ** of a WITHOUT ROWID table and there has been no change the
    ** primary key, then no collision is possible.  The collision detection
    ** logic below can all be skipped. */
    if( isUpdate && pPk==pIdx && pkChng==0 ){
      sqlite3VdbeResolveLabel(v, addrUniqueOk);
      continue;
    }

    /* Find out what action to take in case there is a uniqueness conflict */
    onError = pIdx->onError;
    if( onError==OE_None ){ 
      sqlite3VdbeResolveLabel(v, addrUniqueOk);
      continue;  /* pIdx is not a UNIQUE index */
    }
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }

    /* Figure out if the upsert clause applies to this index */
    if( pUpIdx==pIdx ){
      if( pUpsert->pUpsertSet==0 ){
        onError = OE_Ignore;  /* DO NOTHING is the same as INSERT OR IGNORE */
      }else{
        onError = OE_Update;  /* DO UPDATE */
      }
    }

    /* Collision detection may be omitted if all of the following are true:
    **   (1) The conflict resolution algorithm is REPLACE
    **   (2) The table is a WITHOUT ROWID table
    **   (3) There are no secondary indexes on the table
    **   (4) No delete triggers need to be fired if there is a conflict
    **   (5) No FK constraint counters need to be updated if a conflict occurs.
    **
    ** This is not possible for ENABLE_PREUPDATE_HOOK builds, as the row
    ** must be explicitly deleted in order to ensure any pre-update hook
    ** is invoked.  */ 
#ifndef SQLITE_ENABLE_PREUPDATE_HOOK
    if( (ix==0 && pIdx->pNext==0)                   /* Condition 3 */
     && pPk==pIdx                                   /* Condition 2 */
     && onError==OE_Replace                         /* Condition 1 */
     && ( 0==(db->flags&SQLITE_RecTriggers) ||      /* Condition 4 */
          0==sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0))
     && ( 0==(db->flags&SQLITE_ForeignKeys) ||      /* Condition 5 */
         (0==pTab->pFKey && 0==sqlite3FkReferences(pTab)))
    ){
      sqlite3VdbeResolveLabel(v, addrUniqueOk);
      continue;
    }
#endif /* ifndef SQLITE_ENABLE_PREUPDATE_HOOK */

    /* Check to see if the new index entry will be unique */
    sqlite3VdbeVerifyAbortable(v, onError);
    sqlite3VdbeAddOp4Int(v, OP_NoConflict, iThisCur, addrUniqueOk,
                         regIdx, pIdx->nKeyCol); VdbeCoverage(v);

    /* Generate code to handle collisions */
    regR = (pIdx==pPk) ? regIdx : sqlite3GetTempRange(pParse, nPkField);
    if( isUpdate || onError==OE_Replace ){
      if( HasRowid(pTab) ){
        sqlite3VdbeAddOp2(v, OP_IdxRowid, iThisCur, regR);
        /* Conflict only if the rowid of the existing index entry
        ** is different from old-rowid */
        if( isUpdate ){
          sqlite3VdbeAddOp3(v, OP_Eq, regR, addrUniqueOk, regOldData);
          sqlite3VdbeChangeP5(v, SQLITE_NOTNULL);
          VdbeCoverage(v);
        }
      }else{
        int x;
        /* Extract the PRIMARY KEY from the end of the index entry and
        ** store it in registers regR..regR+nPk-1 */
        if( pIdx!=pPk ){
          for(i=0; i<pPk->nKeyCol; i++){
            assert( pPk->aiColumn[i]>=0 );
            x = sqlite3ColumnOfIndex(pIdx, pPk->aiColumn[i]);
            sqlite3VdbeAddOp3(v, OP_Column, iThisCur, x, regR+i);
            VdbeComment((v, "%s.%s", pTab->zName,
                         pTab->aCol[pPk->aiColumn[i]].zName));
          }
        }
        if( isUpdate ){
          /* If currently processing the PRIMARY KEY of a WITHOUT ROWID 
          ** table, only conflict if the new PRIMARY KEY values are actually
          ** different from the old.
          **
          ** For a UNIQUE index, only conflict if the PRIMARY KEY values
          ** of the matched index row are different from the original PRIMARY
          ** KEY values of this row before the update.  */
          int addrJump = sqlite3VdbeCurrentAddr(v)+pPk->nKeyCol;
          int op = OP_Ne;
          int regCmp = (IsPrimaryKeyIndex(pIdx) ? regIdx : regR);
  
          for(i=0; i<pPk->nKeyCol; i++){
            char *p4 = (char*)sqlite3LocateCollSeq(pParse, pPk->azColl[i]);
            x = pPk->aiColumn[i];
            assert( x>=0 );
            if( i==(pPk->nKeyCol-1) ){
              addrJump = addrUniqueOk;
              op = OP_Eq;
            }
            sqlite3VdbeAddOp4(v, op, 
                regOldData+1+x, addrJump, regCmp+i, p4, P4_COLLSEQ
            );
            sqlite3VdbeChangeP5(v, SQLITE_NOTNULL);
            VdbeCoverageIf(v, op==OP_Eq);
            VdbeCoverageIf(v, op==OP_Ne);
          }
        }
      }
    }

    /* Generate code that executes if the new index entry is not unique */
    assert( onError==OE_Rollback || onError==OE_Abort || onError==OE_Fail
        || onError==OE_Ignore || onError==OE_Replace || onError==OE_Update );
    switch( onError ){
      case OE_Rollback:
      case OE_Abort:
      case OE_Fail: {
        testcase( onError==OE_Rollback );
        testcase( onError==OE_Abort );
        testcase( onError==OE_Fail );
        sqlite3UniqueConstraint(pParse, onError, pIdx);
        break;
      }
#ifndef SQLITE_OMIT_UPSERT
      case OE_Update: {
        sqlite3UpsertDoUpdate(pParse, pUpsert, pTab, pIdx, iIdxCur+ix);
        /* Fall through */
      }
#endif
      case OE_Ignore: {
        testcase( onError==OE_Ignore );
        sqlite3VdbeGoto(v, ignoreDest);
        break;
      }
      default: {
        Trigger *pTrigger = 0;
        assert( onError==OE_Replace );
        if( db->flags&SQLITE_RecTriggers ){
          pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
        }
        if( pTrigger || sqlite3FkRequired(pParse, pTab, 0, 0) ){
          sqlite3MultiWrite(pParse);
        }
        sqlite3GenerateRowDelete(pParse, pTab, pTrigger, iDataCur, iIdxCur,
            regR, nPkField, 0, OE_Replace,
            (pIdx==pPk ? ONEPASS_SINGLE : ONEPASS_OFF), iThisCur);
        seenReplace = 1;
        break;
      }
    }
    if( pUpIdx==pIdx ){
      sqlite3VdbeGoto(v, upsertJump+1);
      sqlite3VdbeJumpHere(v, upsertBypass);
    }else{
      sqlite3VdbeResolveLabel(v, addrUniqueOk);
    }
    if( regR!=regIdx ) sqlite3ReleaseTempRange(pParse, regR, nPkField);
  }

  /* If the IPK constraint is a REPLACE, run it last */
  if( ipkTop ){
    sqlite3VdbeGoto(v, ipkTop);
    VdbeComment((v, "Do IPK REPLACE"));
    sqlite3VdbeJumpHere(v, ipkBottom);
  }

  *pbMayReplace = seenReplace;
  VdbeModuleComment((v, "END: GenCnstCks(%d)", seenReplace));
}